

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O0

void __thiscall Storage::Tape::UEF::get_next_pulses(UEF *this)

{
  bool bVar1;
  float fVar2;
  LogLine local_30;
  int local_28;
  float local_24;
  int baud_rate;
  float new_time_base;
  Chunk next_chunk;
  UEF *this_local;
  
  next_chunk.start_of_next_chunk = (off_t)this;
  while( true ) {
    bVar1 = PulseQueuedTape::empty(&this->super_PulseQueuedTape);
    if (!bVar1) {
      return;
    }
    bVar1 = get_next_chunk(this,(Chunk *)&baud_rate);
    if (!bVar1) break;
    switch((ushort)baud_rate) {
    case 0x100:
      queue_implicit_bit_pattern(this,(uint32_t)new_time_base);
      break;
    default:
      Log::Logger<(Log::Source)29>::info((Logger<(Log::Source)29> *)&local_30);
      Log::Logger<(Log::Source)29>::LogLine::append
                (&local_30,"Skipping chunk of type %04x",(ulong)(ushort)baud_rate);
      Log::Logger<(Log::Source)29>::LogLine::~LogLine(&local_30);
      break;
    case 0x102:
      queue_explicit_bit_pattern(this,(uint32_t)new_time_base);
      break;
    case 0x104:
      queue_defined_data(this,(uint32_t)new_time_base);
      break;
    case 0x110:
      queue_carrier_tone(this);
      break;
    case 0x111:
      queue_carrier_tone_with_dummy(this);
      break;
    case 0x112:
      queue_integer_gap(this);
      break;
    case 0x113:
      local_24 = gzgetfloat(this->file_);
      fVar2 = roundf(local_24);
      this->time_base_ = (uint)(long)fVar2;
      break;
    case 0x114:
      queue_security_cycles(this);
      break;
    case 0x116:
      queue_floating_point_gap(this);
      break;
    case 0x117:
      local_28 = gzget16(this->file_);
      this->is_300_baud_ = local_28 == 300;
    }
    gzseek(this->file_,next_chunk._0_8_,0);
  }
  PulseQueuedTape::set_is_at_end(&this->super_PulseQueuedTape,true);
  return;
}

Assistant:

void UEF::get_next_pulses() {
	while(empty()) {
		// read chunk details
		Chunk next_chunk;
		if(!get_next_chunk(next_chunk)) {
			set_is_at_end(true);
			return;
		}

		switch(next_chunk.id) {
			case 0x0100:	queue_implicit_bit_pattern(next_chunk.length);	break;
			case 0x0102:	queue_explicit_bit_pattern(next_chunk.length);	break;
			case 0x0112:	queue_integer_gap();							break;
			case 0x0116:	queue_floating_point_gap();						break;

			case 0x0110:	queue_carrier_tone();							break;
			case 0x0111:	queue_carrier_tone_with_dummy();				break;

			case 0x0114:	queue_security_cycles();						break;
			case 0x0104:	queue_defined_data(next_chunk.length);			break;

			// change of base rate
			case 0x0113: {
				// TODO: something smarter than just converting this to an int
				const float new_time_base = gzgetfloat(file_);
				time_base_ = unsigned(roundf(new_time_base));
			}
			break;

			case 0x0117: {
				const int baud_rate = gzget16(file_);
				is_300_baud_ = (baud_rate == 300);
			}
			break;

			default:
				logger.info().append("Skipping chunk of type %04x", next_chunk.id);
			break;
		}

		gzseek(file_, next_chunk.start_of_next_chunk, SEEK_SET);
	}
}